

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

int png_colorspace_check_XYZ(png_xy *xy,png_XYZ *XYZ)

{
  undefined1 local_48 [8];
  png_XYZ XYZtemp;
  int result;
  png_XYZ *XYZ_local;
  png_xy *xy_local;
  
  unique0x1000006c = XYZ;
  XYZtemp.blue_Y = png_XYZ_normalize(XYZ);
  xy_local._4_4_ = XYZtemp.blue_Y;
  if ((XYZtemp.blue_Y == 0) &&
     (XYZtemp.blue_Y = png_xy_from_XYZ(xy,stack0xffffffffffffffe0), xy_local._4_4_ = XYZtemp.blue_Y,
     XYZtemp.blue_Y == 0)) {
    memcpy(local_48,stack0xffffffffffffffe0,0x24);
    xy_local._4_4_ = png_colorspace_check_xy((png_XYZ *)local_48,xy);
  }
  return xy_local._4_4_;
}

Assistant:

static int
png_colorspace_check_XYZ(png_xy *xy, png_XYZ *XYZ)
{
   int result;
   png_XYZ XYZtemp;

   result = png_XYZ_normalize(XYZ);
   if (result != 0)
      return result;

   result = png_xy_from_XYZ(xy, XYZ);
   if (result != 0)
      return result;

   XYZtemp = *XYZ;
   return png_colorspace_check_xy(&XYZtemp, xy);
}